

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

bool google::protobuf::internal::WireFormat::ParseAndMergeMessageSetItem
               (CodedInputStream *input,Message *message)

{
  int iVar1;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  byte bVar5;
  uint32_t uVar6;
  uint uVar7;
  FieldDescriptor *pFVar8;
  ulong uVar9;
  byte *pbVar10;
  Reflection *this;
  ulong uVar11;
  byte unaff_BPL;
  uint size;
  uint32_t uVar12;
  string message_data;
  byte *local_a0;
  long local_98;
  byte local_90 [16];
  CodedInputStream local_80;
  
  (*(message->super_MessageLite)._vptr_MessageLite[0x11])(message);
  local_a0 = local_90;
  local_98 = 0;
  local_90[0] = 0;
  uVar12 = 0;
  do {
    pbVar10 = input->buffer_;
    uVar6 = 0;
    if ((pbVar10 < input->buffer_end_) && (uVar6 = (uint32_t)*pbVar10, -1 < (char)*pbVar10)) {
      input->buffer_ = pbVar10 + 1;
    }
    else {
      uVar6 = io::CodedInputStream::ReadTagFallback(input,uVar6);
    }
    if ((int)uVar6 < 0x10) {
      if (uVar6 == 0) {
LAB_003c44f2:
        bVar2 = false;
        unaff_BPL = 0;
      }
      else {
        if (uVar6 != 0xc) {
LAB_003c44de:
          bVar4 = SkipField(input,uVar6,(UnknownFieldSet *)0x0);
LAB_003c44ea:
          if (bVar4 == false) goto LAB_003c44f2;
          goto LAB_003c46f7;
        }
        unaff_BPL = 1;
        bVar2 = false;
      }
    }
    else {
      if (uVar6 != 0x10) {
        if (uVar6 != 0x1a) goto LAB_003c44de;
        if (uVar12 != 0) {
          pFVar8 = Reflection::FindKnownExtensionByNumber(this,uVar12);
          bVar4 = ParseAndMergeMessageSetField(uVar12,pFVar8,message,input);
          goto LAB_003c44ea;
        }
        pbVar10 = input->buffer_;
        if (pbVar10 < input->buffer_end_) {
          bVar5 = *pbVar10;
          uVar9 = (ulong)bVar5;
          uVar12 = (uint32_t)bVar5;
          if ((char)bVar5 < '\0') goto LAB_003c463d;
          input->buffer_ = pbVar10 + 1;
          bVar5 = 0;
        }
        else {
          uVar12 = 0;
LAB_003c463d:
          uVar9 = io::CodedInputStream::ReadVarint32Fallback(input,uVar12);
          bVar5 = (byte)(uVar9 >> 0x3f);
        }
        size = (uint)uVar9;
        uVar12 = 0;
        bVar4 = false;
        bVar3 = 0;
        if (-1 < (int)size && bVar5 == 0) {
          iVar1 = 0x1f;
          if ((size | 1) != 0) {
            for (; (size | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
            }
          }
          bVar5 = (byte)uVar9;
          std::__cxx11::string::resize((ulong)&local_a0,(char)(iVar1 * 9 + 0x49U >> 6) + bVar5);
          *local_a0 = bVar5;
          if (size < 0x80) {
            pbVar10 = local_a0 + 1;
          }
          else {
            *local_a0 = bVar5 | 0x80;
            uVar9 = uVar9 >> 7 & 0x1ffffff;
            local_a0[1] = (byte)uVar9;
            pbVar10 = local_a0 + 2;
            if (0x3fff < size) {
              uVar11 = (ulong)local_a0[1];
              do {
                pbVar10[-1] = (byte)uVar11 | 0x80;
                uVar11 = uVar9 >> 7;
                *pbVar10 = (byte)uVar11;
                pbVar10 = pbVar10 + 1;
                uVar7 = (uint)uVar9;
                uVar9 = uVar11;
              } while (0x3fff < uVar7);
            }
          }
          bVar4 = io::CodedInputStream::ReadRaw(input,pbVar10,size);
          bVar3 = unaff_BPL & bVar4;
        }
        unaff_BPL = bVar3;
        bVar2 = false;
        if (bVar4 != false) goto LAB_003c46f7;
        goto LAB_003c46f9;
      }
      pbVar10 = input->buffer_;
      if (pbVar10 < input->buffer_end_) {
        bVar5 = *pbVar10;
        uVar9 = (ulong)bVar5;
        uVar6 = (uint32_t)bVar5;
        if ((char)bVar5 < '\0') goto LAB_003c4541;
        input->buffer_ = pbVar10 + 1;
        bVar4 = true;
      }
      else {
        uVar6 = 0;
LAB_003c4541:
        uVar9 = io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
        bVar4 = -1 < (long)uVar9;
      }
      uVar6 = (uint32_t)uVar9;
      if (bVar4) {
        uVar12 = uVar6;
        if (local_98 == 0) {
          bVar4 = true;
        }
        else {
          local_80.buffer_ = local_a0;
          local_80.total_bytes_read_ = (int)local_98;
          local_80.buffer_end_ = local_a0 + local_80.total_bytes_read_;
          local_80.input_ = (ZeroCopyInputStream *)0x0;
          local_80.overflow_bytes_ = 0;
          local_80.last_tag_ = 0;
          local_80.legitimate_message_end_ = false;
          local_80.aliasing_enabled_ = false;
          local_80.buffer_size_after_limit_ = 0;
          local_80.total_bytes_limit_ = 0x7fffffff;
          local_80.extension_pool_ = (DescriptorPool *)0x0;
          local_80.extension_factory_ = (MessageFactory *)0x0;
          local_80.recursion_budget_ = input->recursion_budget_;
          local_80.current_limit_ = local_80.total_bytes_read_;
          local_80.recursion_limit_ = local_80.recursion_budget_;
          pFVar8 = Reflection::FindKnownExtensionByNumber(this,uVar6);
          bVar4 = ParseAndMergeMessageSetField(uVar6,pFVar8,message,&local_80);
          if (bVar4) {
            local_98 = 0;
            *local_a0 = 0;
          }
          else {
            unaff_BPL = 0;
          }
          io::CodedInputStream::~CodedInputStream(&local_80);
        }
      }
      else {
        bVar4 = false;
        unaff_BPL = 0;
      }
      if (bVar4 == false) {
        bVar2 = false;
      }
      else {
LAB_003c46f7:
        bVar2 = true;
      }
    }
LAB_003c46f9:
    if (!bVar2) {
      if (local_a0 != local_90) {
        operator_delete(local_a0);
      }
      return (bool)(unaff_BPL & 1);
    }
  } while( true );
}

Assistant:

bool WireFormat::ParseAndMergeMessageSetItem(io::CodedInputStream* input,
                                             Message* message) {
  struct MSReflective {
    bool ParseField(int type_id, io::CodedInputStream* input) {
      const FieldDescriptor* field =
          message_reflection->FindKnownExtensionByNumber(type_id);
      return ParseAndMergeMessageSetField(type_id, field, message, input);
    }

    bool SkipField(uint32_t tag, io::CodedInputStream* input) {
      return WireFormat::SkipField(input, tag, nullptr);
    }

    const Reflection* message_reflection;
    Message* message;
  };

  return ParseMessageSetItemImpl(
      input, MSReflective{message->GetReflection(), message});
}